

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkToNetlist(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    pAVar1 = Abc_NtkLogicToNetlist(pNtk);
    return pAVar1;
  }
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar1 = Abc_NtkAigToLogicSop(pNtk);
    pAVar2 = Abc_NtkLogicToNetlist(pAVar1);
    Abc_NtkDelete(pAVar1);
    return pAVar2;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                ,0x67,"Abc_Ntk_t *Abc_NtkToNetlist(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkToNetlist( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew, * pNtkTemp; 
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkIsStrash(pNtk) )
    {
        pNtkTemp = Abc_NtkAigToLogicSop(pNtk);
        pNtkNew = Abc_NtkLogicToNetlist( pNtkTemp );
        Abc_NtkDelete( pNtkTemp );
        return pNtkNew;
    }
    return Abc_NtkLogicToNetlist( pNtk );
}